

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SetRepeatedString
          (Reflection *this,Message *message,FieldDescriptor *field,int index,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  int number;
  Descriptor *pDVar3;
  CppStringType CVar4;
  uint32_t uVar5;
  RepeatedField<absl::lts_20250127::Cord> *this_00;
  pointer this_01;
  RepeatedPtrFieldBase *this_02;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *this_03;
  string *this_04;
  char *description;
  Metadata MVar6;
  string_view src;
  anon_union_16_2_39e9c77e_for_Rep_0 local_68;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  
  MVar6 = Message::GetMetadata(message);
  if (MVar6.reflection != this) {
LAB_0029eccf:
    pDVar3 = this->descriptor_;
    MVar6 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar3,MVar6.descriptor,field,"SetRepeatedString");
  }
  pDVar3 = this->descriptor_;
  if (field->containing_type_ == pDVar3) {
    bVar2 = field->field_0x1;
    if (0xbf < bVar2 != (bool)((bVar2 & 0x20) >> 5)) {
      SetRepeatedString();
      goto LAB_0029eccf;
    }
    if ((bVar2 & 0x20) != 0) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (pDVar3,field,"SetRepeatedString",CPPTYPE_STRING);
      }
      if ((bVar2 & 8) == 0) {
        CVar4 = FieldDescriptor::cpp_string_type(field);
        if ((CVar4 == kView) || (CVar4 == kString)) {
          VerifyFieldType<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(this,field);
          this_02 = (RepeatedPtrFieldBase *)MutableRawImpl(this,message,field);
          this_03 = internal::RepeatedPtrFieldBase::
                    Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                              (this_02,index);
          std::__cxx11::string::operator=((string *)this_03,(string *)value);
          return;
        }
        if (CVar4 == kCord) {
          src._M_str = (value->_M_dataplus)._M_p;
          src._M_len = value->_M_string_length;
          absl::lts_20250127::Cord::Cord((Cord *)&local_68.as_tree,src,kConstructorString);
          VerifyFieldType<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>(this,field);
          this_00 = (RepeatedField<absl::lts_20250127::Cord> *)MutableRawImpl(this,message,field);
          this_01 = RepeatedField<absl::lts_20250127::Cord>::Mutable(this_00,index);
          if ((anon_union_16_2_39e9c77e_for_Rep_0 *)this_01 != &local_68) {
            if ((((this_01->contents_).data_.rep_.field_0.data[0] & 1U) == 0) &&
               ((local_68.data[0] & 1U) == 0)) {
              (this_01->contents_).data_.rep_.field_0.as_tree.cordz_info =
                   CONCAT71(local_68.as_tree.cordz_info._1_7_,local_68.data[0]);
              (this_01->contents_).data_.rep_.field_0.as_tree.rep = local_68.as_tree.rep;
            }
            else {
              absl::lts_20250127::Cord::InlineRep::AssignSlow
                        (&this_01->contents_,(InlineRep *)&local_68.as_tree);
            }
          }
          absl::lts_20250127::Cord::~Cord((Cord *)&local_68.as_tree);
        }
      }
      else {
        uVar5 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        number = field->number_;
        local_58 = (size_type *)(value->_M_dataplus)._M_p;
        paVar1 = &value->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58 == paVar1) {
          local_48 = paVar1->_M_allocated_capacity;
          uStack_40 = *(undefined8 *)((long)&value->field_2 + 8);
          local_58 = &local_48;
        }
        else {
          local_48 = paVar1->_M_allocated_capacity;
        }
        local_50 = value->_M_string_length;
        (value->_M_dataplus)._M_p = (pointer)paVar1;
        value->_M_string_length = 0;
        (value->field_2)._M_local_buf[0] = '\0';
        this_04 = internal::ExtensionSet::MutableRepeatedString_abi_cxx11_
                            ((ExtensionSet *)
                             ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),
                             number,index);
        std::__cxx11::string::operator=((string *)this_04,(string *)&local_58);
        if (local_58 != &local_48) {
          operator_delete(local_58,local_48 + 1);
        }
      }
      return;
    }
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar3,field,"SetRepeatedString",description);
}

Assistant:

void Reflection::SetRepeatedString(Message* message,
                                   const FieldDescriptor* field, int index,
                                   std::string value) const {
  USAGE_MUTABLE_CHECK_ALL(SetRepeatedString, REPEATED, STRING);
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetRepeatedString(field->number(), index,
                                                    std::move(value));
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        SetRepeatedField<absl::Cord>(message, field, index, absl::Cord(value));
        break;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        MutableRepeatedField<std::string>(message, field, index)
            ->assign(std::move(value));
        break;
    }
  }
}